

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O1

int Constant::Util::getint(char **p)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  pcVar3 = *p;
  cVar1 = *pcVar3;
  while ((int)cVar1 - 0x3aU < 0xfffffff6) {
    pcVar3 = pcVar3 + 1;
    *p = pcVar3;
    cVar1 = *pcVar3;
  }
  pcVar3 = *p;
  iVar4 = (int)*pcVar3;
  iVar2 = 0;
  if (iVar4 - 0x30U < 10) {
    iVar2 = 0;
    do {
      pcVar3 = pcVar3 + 1;
      iVar2 = iVar4 + iVar2 * 10 + -0x30;
      *p = pcVar3;
      iVar4 = (int)*pcVar3;
    } while (iVar4 - 0x30U < 10);
  }
  return iVar2;
}

Assistant:

int Constant::Util::getint(char *&p) {
    while (!isdigit(*p))
        p++;
    int ret = 0;
    while (isdigit(*p)) {
        ret = 10*ret + *p - '0';
        p++;
    }
    return ret;
}